

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O2

void __thiscall
Sobol_IntervalToIndex_Test::Sobol_IntervalToIndex_Test(Sobol_IntervalToIndex_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_02eeb600;
  return;
}

Assistant:

TEST(Sobol, IntervalToIndex) {
    for (int logRes = 0; logRes < 8; ++logRes) {
        int res = 1 << logRes;
        for (int y = 0; y < res; ++y) {
            for (int x = 0; x < res; ++x) {
                // For each pixel sample.
                bool sawCorner = false;
                for (int s = 0; s < 16; ++s) {
                    uint64_t seqIndex = SobolIntervalToIndex(logRes, s, {x, y});
                    Point2f samp(SobolSample(seqIndex, 0, NoRandomizer()),
                                 SobolSample(seqIndex, 1, NoRandomizer()));
                    Point2f ss(samp[0] * res, samp[1] * res);
                    // Make sure all samples aren't landing at the
                    // lower-left corner.
                    if (ss == Point2f(x, y)) {
                        EXPECT_FALSE(sawCorner)
                            << "Multi corner " << Point2i(x, y) << ", res " << res
                            << ", samp " << s << ", seq index " << seqIndex << ", got "
                            << ss << ", from samp " << samp;
                        sawCorner = true;
                    }
                    // Most of the time, the Sobol sample should be within the
                    // pixel's extent. Due to rounding, it may rarely be at the
                    // upper end of the extent; the check here is written
                    // carefully to only accept points just at the upper limit
                    // but not into the next pixel.
                    EXPECT_TRUE(Point2i(x, y) == Point2i(ss) ||
                                (x == int(ss.x) && Float(y + 1) == ss.y ||
                                 Float(x + 1) == ss.x && y == int(ss.y)))
                        << "Pixel " << Point2i(x, y) << ", sample " << s << ", got "
                        << ss;
                }
            }
        }
    }
}